

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmApi.c
# Opt level: O1

Nm_Man_t * Nm_ManCreate(int nSize)

{
  uint uVar1;
  Nm_Man_t *pNVar2;
  Nm_Entry_t **__s;
  Nm_Entry_t **__s_00;
  Extra_MmFlex_t *pEVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  size_t __size;
  
  pNVar2 = (Nm_Man_t *)malloc(0x28);
  pNVar2->nBins = 0;
  pNVar2->nEntries = 0;
  pNVar2->nSizeFactor = 0;
  pNVar2->nGrowthFactor = 0;
  pNVar2->pBinsI2N = (Nm_Entry_t **)0x0;
  pNVar2->pBinsN2I = (Nm_Entry_t **)0x0;
  pNVar2->pMem = (Extra_MmFlex_t *)0x0;
  pNVar2->nSizeFactor = 2;
  pNVar2->nGrowthFactor = 3;
  uVar5 = nSize - 1;
  while( true ) {
    do {
      uVar6 = uVar5 + 1;
      uVar1 = uVar5 & 1;
      uVar5 = uVar6;
    } while (uVar1 != 0);
    if (uVar6 < 9) break;
    iVar4 = 5;
    while( true ) {
      if (uVar6 % (iVar4 - 2U) == 0) break;
      uVar1 = iVar4 * iVar4;
      iVar4 = iVar4 + 2;
      if (uVar6 < uVar1) goto LAB_00418845;
    }
  }
LAB_00418845:
  pNVar2->nBins = uVar6;
  __size = (long)(int)uVar6 << 3;
  __s = (Nm_Entry_t **)malloc(__size);
  pNVar2->pBinsI2N = __s;
  __s_00 = (Nm_Entry_t **)malloc(__size);
  pNVar2->pBinsN2I = __s_00;
  memset(__s,0,__size);
  memset(__s_00,0,__size);
  pEVar3 = Extra_MmFlexStart();
  pNVar2->pMem = pEVar3;
  return pNVar2;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates the name manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Nm_Man_t * Nm_ManCreate( int nSize )
{
    Nm_Man_t * p;
    // allocate the table
    p = ABC_ALLOC( Nm_Man_t, 1 );
    memset( p, 0, sizeof(Nm_Man_t) );
    // set the parameters
    p->nSizeFactor   = 2; // determined the limit on the grow of data before the table resizes
    p->nGrowthFactor = 3; // determined how much the table grows after resizing
    // allocate and clean the bins
    p->nBins = Abc_PrimeCudd(nSize);
    p->pBinsI2N = ABC_ALLOC( Nm_Entry_t *, p->nBins );
    p->pBinsN2I = ABC_ALLOC( Nm_Entry_t *, p->nBins );
    memset( p->pBinsI2N, 0, sizeof(Nm_Entry_t *) * p->nBins );
    memset( p->pBinsN2I, 0, sizeof(Nm_Entry_t *) * p->nBins );
    // start the memory manager
    p->pMem = Extra_MmFlexStart();
    return p;
}